

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::SyncToSetAndBackupInst<false>::Exec
          (SyncToSetAndBackupInst<false> *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  bool bVar2;
  uint *puVar3;
  CharCountOrFlag local_58;
  uint local_54;
  RuntimeCharSet<char16_t> *pRStack_50;
  CharCount maxBackup;
  RuntimeCharSet<char16_t> *matchSet;
  CharCount *pCStack_40;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  Char *pCStack_28;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  SyncToSetAndBackupInst<false> *this_local;
  
  matchSet._7_1_ = firstIteration;
  pCStack_40 = inputOffset;
  inputOffset_local = matchStart;
  matchStart_local._4_4_ = inputLength;
  pCStack_28 = input;
  input_local = (Char *)matcher;
  matcher_local = (Matcher *)this;
  if (inputLength - *matchStart < (this->super_BackupMixin).backup.lower) {
    this_local._7_1_ =
         Matcher::HardFail(matcher,input,inputLength,matchStart,inputOffset,instPointer,contStack,
                           assertionStack,qcTicks,ImmediateFail);
  }
  else if (*inputOffset < *nextSyncInputOffset) {
    *instPointer = *instPointer + 0x31;
    this_local._7_1_ = false;
  }
  else {
    if (*inputOffset - *matchStart < (this->super_BackupMixin).backup.lower) {
      *inputOffset = *matchStart + (this->super_BackupMixin).backup.lower;
    }
    pRStack_50 = &(this->super_SetMixin<false>).set;
    while( true ) {
      bVar2 = false;
      if (*pCStack_40 < matchStart_local._4_4_) {
        bVar2 = RuntimeCharSet<char16_t>::Get(pRStack_50,pCStack_28[*pCStack_40]);
        bVar2 = !bVar2;
      }
      if (!bVar2) break;
      Matcher::CompStats((Matcher *)input_local);
      *pCStack_40 = *pCStack_40 + 1;
    }
    if (*pCStack_40 < matchStart_local._4_4_) {
      *nextSyncInputOffset = *pCStack_40 + 1;
      if ((this->super_BackupMixin).backup.upper != 0xffffffff) {
        local_54 = *pCStack_40 - *inputOffset_local;
        CVar1 = *pCStack_40;
        local_58 = (this->super_BackupMixin).backup.upper;
        puVar3 = min<unsigned_int>(&local_54,&local_58);
        *inputOffset_local = CVar1 - *puVar3;
      }
      *pCStack_40 = *inputOffset_local;
      *instPointer = *instPointer + 0x31;
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ =
           Matcher::HardFail((Matcher *)input_local,pCStack_28,matchStart_local._4_4_,
                             inputOffset_local,pCStack_40,instPointer,contStack,assertionStack,
                             qcTicks,ImmediateFail);
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool SyncToSetAndBackupInst<IsNegation>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        if (backup.lower > inputLength - matchStart)
        {
            // Even match at very end doesn't allow for minimum backup
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        if (inputOffset < nextSyncInputOffset)
        {
            // We have not yet reached the offset in the input we last synced to before backing up, so it's unnecessary to sync
            // again since we'll sync to the same point in the input and back up to the same place we are at now
            instPointer += sizeof(*this);
            return false;
        }

        if (backup.lower > inputOffset - matchStart)
        {
            // No use looking for match until minimum backup is possible
            inputOffset = matchStart + backup.lower;
        }

        const RuntimeCharSet<Char>& matchSet = this->set;
        while (inputOffset < inputLength && matchSet.Get(input[inputOffset]) == IsNegation)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset >= inputLength)
        {
            return matcher.HardFail(HARDFAIL_PARAMETERS(HardFailMode::ImmediateFail));
        }

        nextSyncInputOffset = inputOffset + 1;

        if (backup.upper != CharCountFlag)
        {
            // Backup at most by backup.upper for new start
            CharCount maxBackup = inputOffset - matchStart;
            matchStart = inputOffset - min(maxBackup, (CharCount)backup.upper);
        }
        // else: leave start where it is

        // Move input to new match start
        inputOffset = matchStart;
        instPointer += sizeof(*this);
        return false;
    }